

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O0

ZyanStatus
ZydisStringAppendDecS
          (ZyanString *string,ZyanI64 value,ZyanU8 padding_length,ZyanBool force_sign,
          ZyanStringView *prefix,ZyanStringView *suffix)

{
  ZyanStatus ZVar1;
  ZyanU64 value_00;
  ZyanStatus status_047620348_2;
  ZyanStatus status_047620348_1;
  ZyanStatus status_047620348;
  ZyanStringView *suffix_local;
  ZyanStringView *prefix_local;
  ZyanBool force_sign_local;
  ZyanU8 padding_length_local;
  ZyanI64 value_local;
  ZyanString *string_local;
  
  if (value < 0) {
    string_local._4_4_ = ZydisStringAppendShort(string,&ZydisStringAppendDecS::str_sub);
    if (((string_local._4_4_ & 0x80000000) == 0) &&
       ((prefix == (ZyanStringView *)0x0 ||
        (string_local._4_4_ = ZydisStringAppend(string,prefix),
        (string_local._4_4_ & 0x80000000) == 0)))) {
      value_00 = ZyanAbsI64(value);
      string_local._4_4_ =
           ZydisStringAppendDecU(string,value_00,padding_length,(ZyanStringView *)0x0,suffix);
    }
  }
  else {
    if (force_sign != '\0') {
      if (value < 0) {
        __assert_fail("value >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0x17f,
                      "ZyanStatus ZydisStringAppendDecS(ZyanString *, ZyanI64, ZyanU8, ZyanBool, const ZyanStringView *, const ZyanStringView *)"
                     );
      }
      ZVar1 = ZydisStringAppendShort(string,&ZydisStringAppendDecS::str_add);
      if ((ZVar1 & 0x80000000) != 0) {
        return ZVar1;
      }
    }
    string_local._4_4_ = ZydisStringAppendDecU(string,value,padding_length,prefix,suffix);
  }
  return string_local._4_4_;
}

Assistant:

ZYAN_INLINE ZyanStatus ZydisStringAppendDecS(ZyanString* string, ZyanI64 value,
    ZyanU8 padding_length, ZyanBool force_sign, const ZyanStringView* prefix,
    const ZyanStringView* suffix)
{
    static const ZydisShortString str_add = ZYDIS_MAKE_SHORTSTRING("+");
    static const ZydisShortString str_sub = ZYDIS_MAKE_SHORTSTRING("-");

    if (value < 0)
    {
        ZYAN_CHECK(ZydisStringAppendShort(string, &str_sub));
        if (prefix)
        {
            ZYAN_CHECK(ZydisStringAppend(string, prefix));
        }
        return ZydisStringAppendDecU(string, ZyanAbsI64(value), padding_length,
            (const ZyanStringView*)ZYAN_NULL, suffix);
    }

    if (force_sign)
    {
        ZYAN_ASSERT(value >= 0);
        ZYAN_CHECK(ZydisStringAppendShort(string, &str_add));
    }
    return ZydisStringAppendDecU(string, value, padding_length, prefix, suffix);
}